

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O2

void __thiscall
jsonnet::internal::RuntimeError::RuntimeError
          (RuntimeError *this,
          vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>
          *stack_trace,string *msg)

{
  std::vector<jsonnet::internal::TraceFrame,_std::allocator<jsonnet::internal::TraceFrame>_>::vector
            (&this->stackTrace,stack_trace);
  std::__cxx11::string::string((string *)&this->msg,(string *)msg);
  return;
}

Assistant:

RuntimeError(const std::vector<TraceFrame> stack_trace, const std::string &msg)
        : stackTrace(stack_trace), msg(msg)
    {
    }